

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  cmCPackLog *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  char *name_local;
  cmAlphaNum local_1e8;
  string local_1b8;
  ostringstream cmCPackLog_msg;
  
  name_local = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for template: ");
  pcVar5 = "(NULL)";
  if (name != (char *)0x0) {
    pcVar5 = name;
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x531,(char *)local_1e8.View_._M_len);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  this_00 = this->MakefileMap;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,name,(allocator<char> *)&local_1e8);
  cmMakefile::GetModulesFile(__return_storage_ptr__,this_00,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (__return_storage_ptr__->_M_string_length == 0) {
    psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    _cmCPackLog_msg = (pointer)psVar4->_M_string_length;
    local_1e8.View_._M_len = (size_t)&DAT_00000018;
    local_1e8.View_._M_str = "/Modules/Internal/CPack/";
    cmStrCat<char_const*>(&local_1b8,(cmAlphaNum *)&cmCPackLog_msg,&local_1e8,&name_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
    bVar2 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (!bVar2) {
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Found template: ");
  poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x53e,(char *)local_1e8.View_._M_len);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for template: " << (name ? name : "(NULL)")
                                      << std::endl);
  // Search CMAKE_MODULE_PATH for a custom template.
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  if (ffile.empty()) {
    // Fall back to our internal builtin default.
    ffile = cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/Internal/CPack/",
                     name);
    cmSystemTools::ConvertToUnixSlashes(ffile);
    if (!cmSystemTools::FileExists(ffile)) {
      ffile.clear();
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Found template: " << ffile << std::endl);
  return ffile;
}